

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzSubWMod_fast(word *b,word *a,word w,word *mod,size_t n)

{
  word wVar1;
  
  wVar1 = zzSubW(b,a,n,w);
  if (wVar1 != 0) {
    zzAdd2(b,mod,n);
    return;
  }
  return;
}

Assistant:

void FAST(zzSubWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// a < w => a - w + mod < mod
	if (zzSubW(b, a, n, w))
		zzAdd2(b, mod, n);
	w = 0;
}